

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O0

void TestDisconnectConnection(void)

{
  vector<TestB_*,_std::allocator<TestB_*>_> *this;
  bool bVar1;
  TestB *this_00;
  reference ppTVar2;
  reference ppTVar3;
  TestB *pb_1;
  iterator __end1;
  iterator __begin1;
  vector<TestB_*,_std::allocator<TestB_*>_> *__range1;
  size_t i_2;
  size_t i_1;
  connection local_b0;
  TestB *local_98;
  TestB *pb;
  size_t i;
  size_t count;
  undefined1 local_70 [8];
  TestA ta;
  vector<TestB_*,_std::allocator<TestB_*>_> listeners;
  
  TestRunner::StartTest("TestDisconnectConnection");
  std::vector<TestB_*,_std::allocator<TestB_*>_>::vector
            ((vector<TestB_*,_std::allocator<TestB_*>_> *)((long)&ta.dataB.field_2 + 8));
  TestA::TestA((TestA *)local_70);
  i = 1000;
  for (pb = (TestB *)0x0; pb < (TestB *)0x3e8;
      pb = (TestB *)((long)&(pb->super_slot)._vptr_slot + 1)) {
    this_00 = (TestB *)operator_new(0x50);
    (this_00->explicitConnectionA)._data.
    super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this_00->explicitConnectionA)._data.
    super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)&this_00->dataA = 0;
    (this_00->explicitConnectionA)._vptr_connection = (_func_int **)0x0;
    (this_00->sigB)._data.
    super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (this_00->sigB)._data.
    super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this_00->super_slot)._cleaners.
    super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->super_slot)._cleaners.
    super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->super_slot)._vptr_slot = (_func_int **)0x0;
    (this_00->super_slot)._cleaners.
    super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    TestB::TestB(this_00);
    local_98 = this_00;
    std::vector<TestB_*,_std::allocator<TestB_*>_>::push_back
              ((vector<TestB_*,_std::allocator<TestB_*>_> *)((long)&ta.dataB.field_2 + 8),&local_98)
    ;
    lsignal::signal<void(int)>::connect<TestB,TestB>
              (&local_b0,
               &ta.super_slot._cleaners.
                super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_98,0x1337f0,(slot *)0x0);
    lsignal::connection::operator=(&local_98->explicitConnectionA,&local_b0);
    lsignal::connection::~connection(&local_b0);
  }
  receiveSigACount = 0;
  lsignal::signal<void_(int)>::operator()
            ((signal<void_(int)> *)
             &ta.super_slot._cleaners.
              super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0x17);
  AssertHelper::VerifyValue(true,receiveSigACount == 1000,"Verify siga count1");
  for (i_2 = 0; i_2 < 1000; i_2 = i_2 + 2) {
    ppTVar2 = std::vector<TestB_*,_std::allocator<TestB_*>_>::operator[]
                        ((vector<TestB_*,_std::allocator<TestB_*>_> *)((long)&ta.dataB.field_2 + 8),
                         i_2);
    lsignal::signal<void_(int)>::disconnect
              ((signal<void_(int)> *)
               &ta.super_slot._cleaners.
                super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&(*ppTVar2)->explicitConnectionA)
    ;
  }
  receiveSigACount = 0;
  lsignal::signal<void_(int)>::operator()
            ((signal<void_(int)> *)
             &ta.super_slot._cleaners.
              super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0x22);
  AssertHelper::VerifyValue(true,receiveSigACount == 500,"Verify siga count/2");
  receiveSigACount = 0;
  for (__range1 = (vector<TestB_*,_std::allocator<TestB_*>_> *)0x0;
      __range1 < (vector<TestB_*,_std::allocator<TestB_*>_> *)0x3e8;
      __range1 = (vector<TestB_*,_std::allocator<TestB_*>_> *)
                 ((long)&(__range1->super__Vector_base<TestB_*,_std::allocator<TestB_*>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
    ppTVar2 = std::vector<TestB_*,_std::allocator<TestB_*>_>::operator[]
                        ((vector<TestB_*,_std::allocator<TestB_*>_> *)((long)&ta.dataB.field_2 + 8),
                         (size_type)__range1);
    lsignal::signal<void_(int)>::disconnect
              ((signal<void_(int)> *)
               &ta.super_slot._cleaners.
                super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&(*ppTVar2)->explicitConnectionA)
    ;
  }
  lsignal::signal<void_(int)>::operator()
            ((signal<void_(int)> *)
             &ta.super_slot._cleaners.
              super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0x2d);
  AssertHelper::VerifyValue(true,receiveSigACount == 0,"Verify disconnect_all");
  this = (vector<TestB_*,_std::allocator<TestB_*>_> *)((long)&ta.dataB.field_2 + 8);
  __end1 = std::vector<TestB_*,_std::allocator<TestB_*>_>::begin(this);
  pb_1 = (TestB *)std::vector<TestB_*,_std::allocator<TestB_*>_>::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<TestB_**,_std::vector<TestB_*,_std::allocator<TestB_*>_>_>
                      (&__end1,(__normal_iterator<TestB_**,_std::vector<TestB_*,_std::allocator<TestB_*>_>_>
                                *)&pb_1);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<TestB_**,_std::vector<TestB_*,_std::allocator<TestB_*>_>_>::
              operator*(&__end1);
    if (*ppTVar3 != (TestB *)0x0) {
      (*((*ppTVar3)->super_slot)._vptr_slot[1])();
    }
    __gnu_cxx::__normal_iterator<TestB_**,_std::vector<TestB_*,_std::allocator<TestB_*>_>_>::
    operator++(&__end1);
  }
  TestA::~TestA((TestA *)local_70);
  std::vector<TestB_*,_std::allocator<TestB_*>_>::~vector
            ((vector<TestB_*,_std::allocator<TestB_*>_> *)((long)&ta.dataB.field_2 + 8));
  return;
}

Assistant:

void TestDisconnectConnection()
{
	TestRunner::StartTest(MethodName);
	std::vector<TestB*> listeners;
	TestA ta;
	const size_t count = 1000;
	for (size_t i = 0; i < count; i++)
	{
		TestB* pb = new TestB();
		listeners.push_back(pb);
		pb->explicitConnectionA = ta.sigA.connect(pb, &TestB::ReceiveSigA, pb);
	}

	receiveSigACount = 0;
	ta.sigA(23);
	AssertHelper::VerifyValue(true, receiveSigACount == count, "Verify siga count1");

	for (size_t i = 0; i < count; i += 2)
	{
		ta.sigA.disconnect(listeners[i]->explicitConnectionA);
	}

	receiveSigACount = 0;
	ta.sigA(34);
	AssertHelper::VerifyValue(true, receiveSigACount == count / 2, "Verify siga count/2");

	receiveSigACount = 0;
	for (size_t i = 0; i < count; i++)
	{
		ta.sigA.disconnect(listeners[i]->explicitConnectionA);
	}

	ta.sigA(45);
	AssertHelper::VerifyValue(true, receiveSigACount == 0, "Verify disconnect_all");

	for (TestB* pb : listeners)
		delete pb;
}